

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::outedges(tetgenmesh *this,tetgenio *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  point pt;
  point pt_00;
  long lVar13;
  int *piVar14;
  FILE *pFVar15;
  long lVar16;
  int local_514;
  int local_504;
  int eidx;
  int facenumber;
  int *face2edgelist;
  long fsize_1;
  long tsize_2;
  long tsize_1;
  long vsize;
  long fsize;
  long tsize;
  int *piStack_4c0;
  int tidx;
  int *tet2edgelist;
  int o2index;
  int highorderindex;
  point pp;
  point *extralist;
  int i;
  int t1ver;
  int index2;
  int index1;
  int index;
  int marker;
  int edgenumber;
  int shift;
  int firstindex;
  int ishulledge;
  point tdest;
  point torg;
  face checkseg;
  triface spintet;
  triface worktet;
  triface tetloop;
  char edgefilename [1024];
  FILE *local_20;
  FILE *outfile;
  tetgenio *out_local;
  tetgenmesh *this_local;
  
  local_20 = (FILE *)0x0;
  triface::triface((triface *)&worktet.ver);
  triface::triface((triface *)&spintet.ver);
  triface::triface((triface *)&checkseg.shver);
  face::face((face *)&torg);
  index2 = 0;
  t1ver = 0;
  i = 0;
  _o2index = (point)0x0;
  tet2edgelist._0_4_ = 0;
  piStack_4c0 = (int *)0x0;
  if (out == (tetgenio *)0x0) {
    strcpy((char *)&tetloop.ver,this->b->outfilename);
    strcat((char *)&tetloop.ver,".edge");
  }
  if (this->b->quiet == 0) {
    if (out == (tetgenio *)0x0) {
      printf("Writing %s.\n",&tetloop.ver);
    }
    else {
      printf("Writing edges.\n");
    }
  }
  if (this->meshedges == 0) {
    if (this->nonconvex == 0) {
      lVar16 = this->tetrahedrons->items - this->hullsize;
      tsize_1 = (this->points->items - this->dupverts) - this->unuverts;
      if (this->b->weighted != 0) {
        tsize_1 = tsize_1 - this->nonregularcount;
      }
      this->meshedges = ((tsize_1 + (lVar16 * 4 + this->hullsize) / 2) - lVar16) + -1;
    }
    else {
      numberedges(this);
    }
  }
  this->meshhulledges = 0;
  if (out == (tetgenio *)0x0) {
    local_20 = fopen((char *)&tetloop.ver,"w");
    if (local_20 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",&tetloop.ver);
      terminatetetgen(this,1);
    }
    fprintf(local_20,"%ld  %d\n",this->meshedges,(ulong)((this->b->nobound != 0 ^ 0xffU) & 1));
  }
  else {
    out->numberofedges = (int)this->meshedges;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->meshedges << 1;
    uVar12 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    piVar14 = (int *)operator_new__(uVar12);
    out->edgelist = piVar14;
    if (out->edgelist == (int *)0x0) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this,1);
    }
    if (this->b->order == 2) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = this->meshedges;
      uVar12 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar12 = 0xffffffffffffffff;
      }
      piVar14 = (int *)operator_new__(uVar12);
      out->o2edgelist = piVar14;
    }
    if (this->b->nobound == 0) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = this->meshedges;
      uVar12 = SUB168(auVar3 * ZEXT816(4),0);
      if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
        uVar12 = 0xffffffffffffffff;
      }
      piVar14 = (int *)operator_new__(uVar12);
      out->edgemarkerlist = piVar14;
    }
    if (1 < this->b->neighout) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = this->meshedges;
      uVar12 = SUB168(auVar4 * ZEXT816(4),0);
      if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
        uVar12 = 0xffffffffffffffff;
      }
      piVar14 = (int *)operator_new__(uVar12);
      out->edge2tetlist = piVar14;
    }
  }
  if (1 < this->b->neighout) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->tetrahedrons->items - this->hullsize) * 6;
    uVar12 = SUB168(auVar5 * ZEXT816(4),0);
    if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    piStack_4c0 = (int *)operator_new__(uVar12);
  }
  if (this->b->zeroindex == 0) {
    local_514 = this->in->firstnumber;
  }
  else {
    local_514 = 0;
  }
  marker = 0;
  if ((this->in->firstnumber == 1) && (local_514 == 0)) {
    marker = 1;
  }
  memorypool::traversalinit(this->tetrahedrons);
  worktet._8_8_ = tetrahedrontraverse(this);
  index = local_514;
  while (worktet._8_8_ != 0) {
    spintet.ver = worktet.ver;
    spintet._12_4_ = worktet._12_4_;
    for (extralist._0_4_ = 0; (int)extralist < 6; extralist._0_4_ = (int)extralist + 1) {
      worktet.tet._0_4_ = edge2ver[(int)extralist];
      bVar8 = false;
      fnext(this,(triface *)&spintet.ver,(triface *)&checkseg.shver);
      do {
        bVar7 = ishulltet(this,(triface *)&checkseg.shver);
        if (bVar7) {
          bVar8 = true;
        }
        else {
          iVar9 = elemindex(this,(tetrahedron *)checkseg._8_8_);
          iVar10 = elemindex(this,(tetrahedron *)spintet._8_8_);
          if (iVar9 < iVar10) break;
        }
        iVar9 = (int)spintet.tet;
        decode(this,*(tetrahedron *)(checkseg._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
               (triface *)&checkseg.shver);
        spintet.tet._0_4_ = facepivot2[iVar9][(int)spintet.tet];
      } while (checkseg._8_8_ != spintet._8_8_);
      if (checkseg._8_8_ == spintet._8_8_) {
        if (bVar8) {
          this->meshhulledges = this->meshhulledges + 1;
        }
        pt = org(this,(triface *)&spintet.ver);
        pt_00 = dest(this,(triface *)&spintet.ver);
        if (this->b->order == 2) {
          _o2index = *(point *)(*(long *)(spintet._8_8_ + 0x58) +
                               (long)ver2edge[(int)worktet.tet] * 8);
        }
        if (out == (tetgenio *)0x0) {
          iVar9 = pointmark(this,pt);
          iVar10 = pointmark(this,pt_00);
          fprintf(local_20,"%5d   %4d  %4d",(ulong)(uint)index,(ulong)(uint)(iVar9 - marker),
                  (ulong)(uint)(iVar10 - marker));
          if (this->b->order == 2) {
            iVar9 = pointmark(this,_o2index);
            fprintf(local_20,"  %4d",(ulong)(uint)(iVar9 - marker));
          }
        }
        else {
          iVar9 = pointmark(this,pt);
          iVar10 = index2 + 1;
          out->edgelist[index2] = iVar9 - marker;
          iVar9 = pointmark(this,pt_00);
          index2 = index2 + 2;
          out->edgelist[iVar10] = iVar9 - marker;
          if (this->b->order == 2) {
            iVar9 = pointmark(this,_o2index);
            out->o2edgelist[(int)tet2edgelist] = iVar9 - marker;
            tet2edgelist._0_4_ = (int)tet2edgelist + 1;
          }
        }
        if (this->b->nobound == 0) {
          if ((this->b->plc == 0) && (this->b->refine == 0)) {
            index1 = (int)bVar8;
          }
          else {
            tsspivot1(this,(triface *)&spintet.ver,(face *)&torg);
            if (torg == (point)0x0) {
              index1 = 0;
            }
            else {
              index1 = shellmark(this,(face *)&torg);
            }
          }
          if (out == (tetgenio *)0x0) {
            fprintf(local_20,"  %d",(ulong)(uint)index1);
          }
          else {
            out->edgemarkerlist[t1ver] = index1;
            t1ver = t1ver + 1;
          }
        }
        if (1 < this->b->neighout) {
          if (out == (tetgenio *)0x0) {
            uVar11 = elemindex(this,(tetrahedron *)worktet._8_8_);
            fprintf(local_20,"  %d",(ulong)uVar11);
          }
          else {
            iVar9 = elemindex(this,(tetrahedron *)worktet._8_8_);
            out->edge2tetlist[i] = iVar9;
            i = i + 1;
          }
          triface::operator=((triface *)&checkseg.shver,(triface *)&spintet.ver);
          do {
            bVar8 = ishulltet(this,(triface *)&checkseg.shver);
            if (!bVar8) {
              iVar9 = elemindex(this,(tetrahedron *)checkseg._8_8_);
              piStack_4c0[(iVar9 - local_514) * 6 + ver2edge[(int)spintet.tet]] = index;
            }
            iVar9 = (int)spintet.tet;
            decode(this,*(tetrahedron *)(checkseg._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
                   (triface *)&checkseg.shver);
            spintet.tet._0_4_ = facepivot2[iVar9][(int)spintet.tet];
          } while (checkseg._8_8_ != spintet._8_8_);
        }
        if (out == (tetgenio *)0x0) {
          fprintf(local_20,"\n");
        }
        index = index + 1;
      }
    }
    worktet._8_8_ = tetrahedrontraverse(this);
  }
  if (out == (tetgenio *)0x0) {
    fprintf(local_20,"# Generated by %s\n",this->b->commandline);
    fclose(local_20);
  }
  if (1 < this->b->neighout) {
    lVar16 = this->tetrahedrons->items - this->hullsize;
    if (this->b->facesout != 0) {
      lVar13 = (lVar16 * 4 + this->hullsize) / 2;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = lVar13 * 3;
      uVar12 = SUB168(auVar6 * ZEXT816(4),0);
      if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
        uVar12 = 0xffffffffffffffff;
      }
      piVar14 = (int *)operator_new__(uVar12);
      memorypool::traversalinit(this->tetrahedrons);
      worktet._8_8_ = tetrahedrontraverse(this);
      local_504 = 0;
      while (worktet._8_8_ != 0) {
        for (tetloop.tet._0_4_ = 0; (int)tetloop.tet < 4; tetloop.tet._0_4_ = (int)tetloop.tet + 1)
        {
          fsym(this,(triface *)&worktet.ver,(triface *)&checkseg.shver);
          bVar8 = ishulltet(this,(triface *)&checkseg.shver);
          if (bVar8) {
LAB_00170a50:
            iVar9 = elemindex(this,(tetrahedron *)worktet._8_8_);
            triface::operator=((triface *)&spintet.ver,(triface *)&worktet.ver);
            for (extralist._0_4_ = 0; (int)extralist < 3; extralist._0_4_ = (int)extralist + 1) {
              enextself(this,(triface *)&spintet.ver);
              piVar14[local_504 * 3 + (int)extralist] =
                   piStack_4c0[(iVar9 - local_514) * 6 + ver2edge[(int)worktet.tet]];
            }
            local_504 = local_504 + 1;
          }
          else {
            iVar9 = elemindex(this,(tetrahedron *)worktet._8_8_);
            iVar10 = elemindex(this,(tetrahedron *)checkseg._8_8_);
            if (iVar9 < iVar10) goto LAB_00170a50;
          }
        }
        worktet._8_8_ = tetrahedrontraverse(this);
      }
      if (out == (tetgenio *)0x0) {
        strcpy((char *)&tetloop.ver,this->b->outfilename);
        strcat((char *)&tetloop.ver,".f2e");
      }
      if (this->b->quiet == 0) {
        if (out == (tetgenio *)0x0) {
          printf("Writing %s.\n",&tetloop.ver);
        }
        else {
          printf("Writing face-to-edge map.\n");
        }
      }
      if (out == (tetgenio *)0x0) {
        pFVar15 = fopen((char *)&tetloop.ver,"w");
        for (tsize._4_4_ = 0; tsize._4_4_ < lVar13; tsize._4_4_ = tsize._4_4_ + 1) {
          iVar9 = tsize._4_4_ * 3;
          fprintf(pFVar15,"%4d  %d %d %d\n",(ulong)(uint)(tsize._4_4_ + this->in->firstnumber),
                  (ulong)(uint)piVar14[iVar9],(ulong)(uint)piVar14[iVar9 + 1],
                  (ulong)(uint)piVar14[iVar9 + 2]);
        }
        fclose(pFVar15);
        if (piVar14 != (int *)0x0) {
          operator_delete__(piVar14);
        }
      }
      else {
        out->face2edgelist = piVar14;
      }
    }
    if (out == (tetgenio *)0x0) {
      strcpy((char *)&tetloop.ver,this->b->outfilename);
      strcat((char *)&tetloop.ver,".t2e");
    }
    if (this->b->quiet == 0) {
      if (out == (tetgenio *)0x0) {
        printf("Writing %s.\n",&tetloop.ver);
      }
      else {
        printf("Writing tetrahedron-to-edge map.\n");
      }
    }
    if (out == (tetgenio *)0x0) {
      pFVar15 = fopen((char *)&tetloop.ver,"w");
      for (tsize._4_4_ = 0; tsize._4_4_ < lVar16; tsize._4_4_ = tsize._4_4_ + 1) {
        iVar9 = tsize._4_4_ * 6;
        fprintf(pFVar15,"%4d  %d %d %d %d %d %d\n",
                (ulong)(uint)(tsize._4_4_ + this->in->firstnumber),(ulong)(uint)piStack_4c0[iVar9],
                (ulong)(uint)piStack_4c0[iVar9 + 1],(ulong)(uint)piStack_4c0[iVar9 + 2],
                piStack_4c0[iVar9 + 3],piStack_4c0[iVar9 + 4],piStack_4c0[iVar9 + 5]);
      }
      fclose(pFVar15);
      if (piStack_4c0 != (int *)0x0) {
        operator_delete__(piStack_4c0);
      }
    }
    else {
      out->tet2edgelist = piStack_4c0;
    }
  }
  return;
}

Assistant:

void tetgenmesh::outedges(tetgenio* out)
{
  FILE *outfile = NULL;
  char edgefilename[FILENAMESIZE];
  triface tetloop, worktet, spintet;
  face checkseg;
  point torg, tdest;
  int ishulledge;
  int firstindex, shift;
  int edgenumber, marker;
  int index = 0, index1 = 0, index2 = 0;
  int t1ver;
  int i;

  // For -o2 option.
  point *extralist, pp = NULL; 
  int highorderindex = 11;
  int o2index = 0;

  // For -nn option.
  int *tet2edgelist = NULL;
  int tidx;

  if (out == (tetgenio *) NULL) {
    strcpy(edgefilename, b->outfilename);
    strcat(edgefilename, ".edge");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", edgefilename);
    } else {
      printf("Writing edges.\n");
    }
  }

  if (meshedges == 0l) {
    if (nonconvex) {
      numberedges();  // Count the edges.
    } else {
      // Use Euler's characteristic to get the numbe of edges.
      // It states V - E + F - C = 1, hence E = V + F - C - 1.
      long tsize = tetrahedrons->items - hullsize;
      long fsize = (tsize * 4l + hullsize) / 2l;
      long vsize = points->items - dupverts - unuverts;
      if (b->weighted) vsize -= nonregularcount;
      meshedges = vsize + fsize - tsize - 1;
    }
  }
  meshhulledges = 0l; // It will be counted.

  if (out == (tetgenio *) NULL) {
    outfile = fopen(edgefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", edgefilename);
      terminatetetgen(this, 1);
    }
    // Write the number of edges, boundary markers (0 or 1).
    fprintf(outfile, "%ld  %d\n", meshedges, !b->nobound);
  } else {
    // Allocate memory for 'edgelist'.
    out->numberofedges = meshedges;
    out->edgelist = new int[meshedges * 2];
    if (out->edgelist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    if (b->order == 2) { // -o2 switch
      out->o2edgelist = new int[meshedges];
    }
    if (!b->nobound) {
      out->edgemarkerlist = new int[meshedges];
    }
    if (b->neighout > 1) { // '-nn' switch.
      out->edge2tetlist = new int[meshedges];
    }
  }

  if (b->neighout > 1) { // -nn option
    // Output the tetrahedron-to-edge map.
	long tsize = tetrahedrons->items - hullsize;
    tet2edgelist = new int[tsize * 6];
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift (reduce) the output indices by 1.
  }

  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  edgenumber = firstindex; // in->firstnumber;
  while (tetloop.tet != (tetrahedron *) NULL) {
    // Count the number of Voronoi faces. 
    worktet.tet = tetloop.tet;
    for (i = 0; i < 6; i++) {
      worktet.ver = edge2ver[i];
      ishulledge = 0;
      fnext(worktet, spintet);
      do {
        if (!ishulltet(spintet)) {
          if (elemindex(spintet.tet) < elemindex(worktet.tet)) break;
        } else {
          ishulledge = 1;
        }
        fnextself(spintet);
      } while (spintet.tet != worktet.tet);
      if (spintet.tet == worktet.tet) {
        // Found a new edge.
        if (ishulledge) meshhulledges++;
        torg = org(worktet);
        tdest = dest(worktet);
        if (b->order == 2) { // -o2
          // Get the extra vertex on this edge.
          extralist = (point *) worktet.tet[highorderindex];
          pp = extralist[ver2edge[worktet.ver]];
        }
        if (out == (tetgenio *) NULL) {
          fprintf(outfile, "%5d   %4d  %4d", edgenumber,
                  pointmark(torg) - shift, pointmark(tdest) - shift);
          if (b->order == 2) { // -o2
            fprintf(outfile, "  %4d", pointmark(pp) - shift);
          }
        } else {
          // Output three vertices of this face;
          out->edgelist[index++] = pointmark(torg) - shift;
          out->edgelist[index++] = pointmark(tdest) - shift;
          if (b->order == 2) { // -o2
            out->o2edgelist[o2index++] = pointmark(pp) - shift;
          }
        }
        if (!b->nobound) {
          if (b->plc || b->refine) {
            // Check if the edge is a segment.
            tsspivot1(worktet, checkseg);
            if (checkseg.sh != NULL) {
              marker = shellmark(checkseg);
            } else {
              marker = 0;  // It's not a segment.
            }
          } else {
            // Mark it if it is a hull edge.
            marker = ishulledge ? 1 : 0;
          }
          if (out == (tetgenio *) NULL) {
            fprintf(outfile, "  %d", marker);
          } else {
            out->edgemarkerlist[index1++] = marker;
          }
        }
        if (b->neighout > 1) { // '-nn' switch.
          if (out == (tetgenio *) NULL) {
            fprintf(outfile, "  %d", elemindex(tetloop.tet));
          } else {
            out->edge2tetlist[index2++] = elemindex(tetloop.tet);
          }
		  // Fill the tetrahedron-to-edge map.
		  spintet = worktet;
		  while (1) {
		    if (!ishulltet(spintet)) {
			  tidx = elemindex(spintet.tet) - firstindex;
			  tet2edgelist[tidx * 6 + ver2edge[spintet.ver]] = edgenumber;
			}
		    fnextself(spintet);
			if (spintet.tet == worktet.tet) break;
		  }
        }
        if (out == (tetgenio *) NULL) {
          fprintf(outfile, "\n");
        }
        edgenumber++;
      }
    }
    tetloop.tet = tetrahedrontraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }

  if (b->neighout > 1) { // -nn option
    long tsize = tetrahedrons->items - hullsize;

    if (b->facesout) { // -f option
      // Build the face-to-edge map (use the tet-to-edge map).
	  long fsize = (tsize * 4l + hullsize) / 2l;
	  int *face2edgelist = new int[fsize * 3];

	  tetrahedrons->traversalinit();
      tetloop.tet = tetrahedrontraverse();
      int facenumber = 0; // firstindex; // in->firstnumber;
	  while (tetloop.tet != (tetrahedron *) NULL) {
	    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
		  fsym(tetloop, spintet);
		  if (ishulltet(spintet) || 
              (elemindex(tetloop.tet) < elemindex(spintet.tet))) {
            // The three edges of this face are ordered such that the
			//    first edge is opposite to the first vertex of this face
			//    that appears in the .face file, and so on.
			tidx = elemindex(tetloop.tet) - firstindex; 
			worktet = tetloop;
            for (i = 0; i < 3; i++) {
			  enextself(worktet); // The edge opposite to vertex i.
			  int eidx = tet2edgelist[tidx * 6 + ver2edge[worktet.ver]];
			  face2edgelist[facenumber * 3 + i] = eidx;
			}
		    facenumber++;
		  }
		}
	    tetloop.tet = tetrahedrontraverse();
	  }

	  // Output the face-to-edge map.
	  if (out == (tetgenio *) NULL) {
	    strcpy(edgefilename, b->outfilename);
        strcat(edgefilename, ".f2e");
      }
	  if (!b->quiet) {
        if (out == (tetgenio *) NULL) {
          printf("Writing %s.\n", edgefilename);
        } else {
          printf("Writing face-to-edge map.\n");
        }
      }
	  if (out == (tetgenio *) NULL) {
	    outfile = fopen(edgefilename, "w");
	    for (tidx = 0; tidx < fsize; tidx++) { // Re-use `tidx'
	      i = tidx * 3;
		  fprintf(outfile, "%4d  %d %d %d\n", tidx + in->firstnumber,
		          face2edgelist[i], face2edgelist[i+1], face2edgelist[i+2]);
	    }
	    fclose(outfile);
	    delete [] face2edgelist;
	  } else {
	    // Simply copy the address of the list to the output.
	    out->face2edgelist = face2edgelist;
      }
    } // if (b->facesout)

    // Output the tetrahedron-to-edge map.
	if (out == (tetgenio *) NULL) {
	  strcpy(edgefilename, b->outfilename);
      strcat(edgefilename, ".t2e");
    }
	if (!b->quiet) {
      if (out == (tetgenio *) NULL) {
        printf("Writing %s.\n", edgefilename);
      } else {
        printf("Writing tetrahedron-to-edge map.\n");
      }
    }
	if (out == (tetgenio *) NULL) {
	  outfile = fopen(edgefilename, "w");
	  for (tidx = 0; tidx < tsize; tidx++) {
	    i = tidx * 6;
		fprintf(outfile, "%4d  %d %d %d %d %d %d\n", tidx + in->firstnumber,
		        tet2edgelist[i], tet2edgelist[i+1], tet2edgelist[i+2],  
				tet2edgelist[i+3], tet2edgelist[i+4], tet2edgelist[i+5]);
	  }
	  fclose(outfile);
	  delete [] tet2edgelist;
	} else {
	  // Simply copy the address of the list to the output.
	  out->tet2edgelist = tet2edgelist;
    }
  }
}